

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::costEvaluation
          (L2NormCost *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  L2NormCostImplementation *pLVar2;
  bool bVar3;
  double controlCost;
  double stateCost;
  string local_70;
  double local_50;
  double local_48;
  double local_40;
  double *local_38;
  
  local_40 = 0.0;
  local_48 = 0.0;
  pLVar2 = this->m_pimpl;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_50 = time;
  local_38 = costValue;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"state","");
  bVar3 = CostAttributes::evaluateCost(&pLVar2->stateCost,local_50,state,&local_40,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    pLVar2 = this->m_pimpl;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"control","");
    bVar3 = CostAttributes::evaluateCost(&pLVar2->controlCost,local_50,control,&local_48,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      *local_38 = local_40 + local_48;
      return true;
    }
  }
  return false;
}

Assistant:

bool L2NormCost::costEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, double &costValue)
        {
            double stateCost = 0, controlCost = 0;

            if (!m_pimpl->stateCost.evaluateCost(time, state, stateCost, "state"))
                return false;

            if (!m_pimpl->controlCost.evaluateCost(time, control, controlCost, "control"))
                return false;

            costValue = stateCost + controlCost;

            return true;
        }